

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.hpp
# Opt level: O2

void __thiscall boost::deflate::deflate_stream::deflate_stream(deflate_stream *this)

{
  detail::deflate_stream::deflate_stream(&this->super_deflate_stream);
  detail::deflate_stream::doReset(&this->super_deflate_stream,6,0xf,9,normal,none);
  return;
}

Assistant:

deflate_stream()
    {
        reset(6, 15, default_mem_level, Strategy::normal,boost::deflate::wrap::none);
    }